

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v7::detail::vformat_to<char>
               (buffer<char> *buf,basic_string_view<char> format_str,
               basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               args,locale_ref loc)

{
  undefined1 value [16];
  undefined1 value_00 [16];
  basic_string_view<char> value_01;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  format_args;
  basic_string_view<char> str;
  handle handle;
  custom_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> custom;
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  char **out_00;
  char *in_RCX;
  char **ppcVar4;
  size_t in_RDX;
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *in_RSI;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R8;
  void *in_R9;
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  h;
  format_arg arg;
  buffer_appender<char> out;
  char *p_1;
  writer write;
  char c;
  char *p;
  char *end;
  char *begin;
  buffer<char> *in_stack_fffffffffffffe08;
  undefined2 in_stack_fffffffffffffe10;
  undefined2 in_stack_fffffffffffffe12;
  float in_stack_fffffffffffffe14;
  default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  char in_stack_fffffffffffffe27;
  undefined2 in_stack_fffffffffffffe28;
  undefined2 uVar5;
  undefined2 in_stack_fffffffffffffe2a;
  undefined2 uVar6;
  int in_stack_fffffffffffffe2c;
  undefined4 uVar7;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *in_stack_fffffffffffffe30;
  default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *in_stack_fffffffffffffe38;
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *in_stack_fffffffffffffe40;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  begin_00;
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *this;
  default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *in_stack_fffffffffffffe78;
  void *in_stack_fffffffffffffe80;
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> local_140;
  char *local_118;
  _func_void_void_ptr_parse_context_ptr_basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_ptr
  *p_Stack_110;
  undefined4 local_108;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_f0;
  locale_ref local_e0;
  undefined8 local_d8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aStack_d0;
  basic_string_view<char> local_c8 [2];
  handle local_a8;
  basic_string_view<char> local_98 [3];
  char **local_60;
  default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> *local_58;
  char **local_48;
  undefined1 *local_40;
  char local_31;
  char **local_30;
  char **local_28;
  char **local_20;
  undefined1 *local_18;
  basic_string_view<char> local_10;
  
  local_e0.locale_ = in_R9;
  local_d8 = in_RCX;
  aStack_d0 = in_R8;
  local_c8[0].data_ = (char *)in_RSI;
  local_c8[0].size_ = in_RDX;
  buffer_appender<char>::buffer_appender
            ((buffer_appender<char> *)
             CONCAT44(in_stack_fffffffffffffe14,
                      CONCAT22(in_stack_fffffffffffffe12,in_stack_fffffffffffffe10)),
             in_stack_fffffffffffffe08);
  sVar2 = basic_string_view<char>::size(local_c8);
  if (sVar2 == 2) {
    pcVar3 = basic_string_view<char>::data(local_c8);
    bVar1 = equal2(pcVar3,"{}");
    if (bVar1) {
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::get(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      bVar1 = basic_format_arg::operator_cast_to_bool((basic_format_arg *)&local_118);
      if (bVar1) {
        local_140.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
             (back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_f0.container;
        local_140.args.desc_._0_4_ = (undefined4)local_d8;
        local_140.args.desc_._4_4_ = local_d8._4_4_;
        local_140.args.field_1._0_4_ = aStack_d0._0_4_;
        local_140.args.field_1._4_4_ = aStack_d0._4_4_;
        local_140.loc.locale_ = local_e0.locale_;
        local_58 = &local_140;
        local_60 = &local_118;
        bVar1 = SUB41((uint)in_stack_fffffffffffffe14 >> 0x18,0);
        switch(local_108) {
        case 0:
          break;
        case 1:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    (in_stack_fffffffffffffe18,(int)in_stack_fffffffffffffe14);
          return;
        case 2:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    (in_stack_fffffffffffffe18,(uint)in_stack_fffffffffffffe14);
          return;
        case 3:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    (in_stack_fffffffffffffe18,
                     CONCAT44(in_stack_fffffffffffffe14,
                              CONCAT22(in_stack_fffffffffffffe12,in_stack_fffffffffffffe10)));
          return;
        case 4:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    (in_stack_fffffffffffffe18,
                     CONCAT44(in_stack_fffffffffffffe14,
                              CONCAT22(in_stack_fffffffffffffe12,in_stack_fffffffffffffe10)));
          return;
        case 5:
          value[7] = in_stack_fffffffffffffe27;
          value._0_7_ = in_stack_fffffffffffffe20;
          value._8_2_ = in_stack_fffffffffffffe28;
          value._10_2_ = in_stack_fffffffffffffe2a;
          value._12_4_ = in_stack_fffffffffffffe2c;
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    (in_stack_fffffffffffffe38,(__int128)value);
          return;
        case 6:
          value_00[7] = in_stack_fffffffffffffe27;
          value_00._0_7_ = in_stack_fffffffffffffe20;
          value_00._8_2_ = in_stack_fffffffffffffe28;
          value_00._10_2_ = in_stack_fffffffffffffe2a;
          value_00._12_4_ = in_stack_fffffffffffffe2c;
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    (in_stack_fffffffffffffe38,(unsigned___int128)value_00);
          return;
        case 7:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    (in_stack_fffffffffffffe18,bVar1);
          return;
        case 8:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    (in_stack_fffffffffffffe18,bVar1);
          return;
        case 9:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    (in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
          return;
        case 10:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    (in_stack_fffffffffffffe18,
                     (double)CONCAT44(in_stack_fffffffffffffe14,
                                      CONCAT22(in_stack_fffffffffffffe12,in_stack_fffffffffffffe10))
                    );
          return;
        case 0xb:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    (in_stack_fffffffffffffe38,
                     (longdouble)
                     CONCAT28(in_stack_fffffffffffffe28,
                              CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20)));
          return;
        case 0xc:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    (in_stack_fffffffffffffe18,
                     (char *)CONCAT44(in_stack_fffffffffffffe14,
                                      CONCAT22(in_stack_fffffffffffffe12,in_stack_fffffffffffffe10))
                    );
          return;
        case 0xd:
          uVar5 = SUB82(local_58,0);
          uVar6 = (undefined2)((ulong)local_58 >> 0x10);
          uVar7 = (undefined4)((ulong)local_58 >> 0x20);
          basic_string_view<char>::basic_string_view(local_98,local_118,(size_t)p_Stack_110);
          value_01.data_._7_1_ = in_stack_fffffffffffffe27;
          value_01.data_._0_7_ = in_stack_fffffffffffffe20;
          value_01.size_._0_2_ = uVar5;
          value_01.size_._2_2_ = uVar6;
          value_01.size_._4_4_ = uVar7;
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    (in_stack_fffffffffffffe18,value_01);
          return;
        case 0xe:
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()
                    (in_stack_fffffffffffffe18,
                     (void *)CONCAT44(in_stack_fffffffffffffe14,
                                      CONCAT22(in_stack_fffffffffffffe12,in_stack_fffffffffffffe10))
                    );
          return;
        case 0xf:
          custom.format = p_Stack_110;
          custom.value = local_118;
          basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::handle::handle(&local_a8,custom);
          handle.custom_.format =
               (_func_void_void_ptr_parse_context_ptr_basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_ptr
                *)in_stack_fffffffffffffe88;
          handle.custom_.value = in_stack_fffffffffffffe80;
          default_arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::operator()
                    (in_stack_fffffffffffffe78,handle);
          return;
        }
        default_arg_formatter<fmt::v7::detail::buffer_appender<char>,char>::operator()(local_58);
        return;
      }
      error_handler::on_error
                ((error_handler *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                 (char *)in_stack_fffffffffffffe18);
    }
  }
  str.size_ = local_c8[0].size_;
  str.data_ = local_c8[0].data_;
  format_args.field_1.values_ = aStack_d0.values_;
  format_args.desc_ = (unsigned_long_long)local_d8;
  this = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          *)local_c8[0].data_;
  format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  ::format_handler(in_stack_fffffffffffffe40,(buffer_appender<char>)local_f0.container,str,
                   format_args,local_e0);
  local_10.data_ = local_c8[0].data_;
  local_10.size_ = local_c8[0].size_;
  local_18 = &stack0xfffffffffffffe78;
  out_00 = (char **)basic_string_view<char>::data(&local_10);
  local_20 = out_00;
  sVar2 = basic_string_view<char>::size(&local_10);
  local_28 = (char **)((long)out_00 + sVar2);
  if ((long)local_28 - (long)local_20 < 0x20) {
    local_30 = local_20;
    pcVar3 = local_d8;
    begin_00 = aStack_d0;
    while (local_30 != local_28) {
      ppcVar4 = (char **)((long)local_30 + 1);
      local_31 = *(char *)local_30;
      local_30 = ppcVar4;
      if (local_31 == '{') {
        format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::on_text(this,(char *)begin_00.values_,pcVar3);
        local_20 = (char **)parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                                      (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                                       in_stack_fffffffffffffe88);
        local_30 = local_20;
      }
      else if (local_31 == '}') {
        if ((ppcVar4 == local_28) || (*(char *)ppcVar4 != '}')) {
          error_handler::on_error
                    ((error_handler *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                     (char *)out_00);
        }
        format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::on_text(this,(char *)begin_00.values_,pcVar3);
        local_30 = (char **)((long)local_30 + 1);
        local_20 = local_30;
      }
    }
    format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::on_text(this,(char *)begin_00.values_,pcVar3);
  }
  else {
    local_40 = local_18;
    while (local_20 != local_28) {
      local_48 = local_20;
      if ((*(char *)local_20 != '{') &&
         (bVar1 = find<false,char,char_const*>
                            ((char *)in_stack_fffffffffffffe30,
                             (char *)CONCAT44(in_stack_fffffffffffffe2c,
                                              CONCAT22(in_stack_fffffffffffffe2a,
                                                       in_stack_fffffffffffffe28)),
                             in_stack_fffffffffffffe27,out_00), !bVar1)) {
        parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&>
        ::writer::operator()
                  ((writer *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                   (char *)out_00,
                   (char *)CONCAT44(in_stack_fffffffffffffe14,
                                    CONCAT22(in_stack_fffffffffffffe12,in_stack_fffffffffffffe10)));
        return;
      }
      parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&>
      ::writer::operator()
                ((writer *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                 (char *)out_00,
                 (char *)CONCAT44(in_stack_fffffffffffffe14,
                                  CONCAT22(in_stack_fffffffffffffe12,in_stack_fffffffffffffe10)));
      local_20 = (char **)parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                                    (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                                     in_stack_fffffffffffffe88);
    }
  }
  return;
}

Assistant:

void detail::vformat_to(
    detail::buffer<Char>& buf, basic_string_view<Char> format_str,
    basic_format_args<buffer_context<type_identity_t<Char>>> args,
    detail::locale_ref loc) {
  using iterator = typename buffer_context<Char>::iterator;
  auto out = buffer_appender<Char>(buf);
  if (format_str.size() == 2 && equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    visit_format_arg(default_arg_formatter<iterator, Char>{out, args, loc},
                     arg);
    return;
  }
  format_handler<iterator, Char, buffer_context<Char>> h(out, format_str, args,
                                                         loc);
  parse_format_string<false>(format_str, h);
}